

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

CScriptCheck * __thiscall CScriptCheck::operator=(CScriptCheck *this,CScriptCheck *param_1)

{
  CScript *pCVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_type sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  CTransaction *pCVar10;
  PrecomputedTransactionData *pPVar11;
  undefined3 uVar12;
  ScriptError SVar13;
  uint uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_tx_out).nValue = (param_1->m_tx_out).nValue;
  pCVar1 = &(this->m_tx_out).scriptPubKey;
  if (0x1c < (this->m_tx_out).scriptPubKey.super_CScriptBase._size) {
    free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
  }
  uVar3 = *(undefined4 *)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union;
  uVar4 = *(undefined4 *)((long)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union + 4);
  sVar5 = (param_1->m_tx_out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
  uVar6 = *(undefined4 *)((long)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union + 0xc);
  uVar7 = *(undefined4 *)((long)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union + 0x10);
  uVar8 = *(undefined4 *)((long)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union + 0x14);
  uVar9 = *(undefined4 *)((long)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union + 0x18);
  *(undefined4 *)((long)&(this->m_tx_out).scriptPubKey.super_CScriptBase._union + 0xc) =
       *(undefined4 *)((long)&(param_1->m_tx_out).scriptPubKey.super_CScriptBase._union + 0xc);
  *(undefined4 *)((long)&(this->m_tx_out).scriptPubKey.super_CScriptBase._union + 0x10) = uVar7;
  *(undefined4 *)((long)&(this->m_tx_out).scriptPubKey.super_CScriptBase._union + 0x14) = uVar8;
  *(undefined4 *)((long)&(this->m_tx_out).scriptPubKey.super_CScriptBase._union + 0x18) = uVar9;
  *(undefined4 *)&(pCVar1->super_CScriptBase)._union = uVar3;
  *(undefined4 *)((long)&(this->m_tx_out).scriptPubKey.super_CScriptBase._union + 4) = uVar4;
  (this->m_tx_out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity = sVar5;
  *(undefined4 *)((long)&(this->m_tx_out).scriptPubKey.super_CScriptBase._union + 0xc) = uVar6;
  (this->m_tx_out).scriptPubKey.super_CScriptBase._size =
       (param_1->m_tx_out).scriptPubKey.super_CScriptBase._size;
  (param_1->m_tx_out).scriptPubKey.super_CScriptBase._size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    this->m_signature_cache = param_1->m_signature_cache;
    pCVar10 = param_1->ptxTo;
    uVar14 = param_1->nIn;
    uVar15 = param_1->nFlags;
    uVar12 = *(undefined3 *)&param_1->field_0x39;
    SVar13 = param_1->error;
    pPVar11 = param_1->txdata;
    this->cacheStore = param_1->cacheStore;
    *(undefined3 *)&this->field_0x39 = uVar12;
    this->error = SVar13;
    this->txdata = pPVar11;
    this->ptxTo = pCVar10;
    this->nIn = uVar14;
    this->nFlags = uVar15;
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CScriptCheck& operator=(CScriptCheck&&) = default;